

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system.cxx
# Opt level: O1

bool __thiscall xray_re::xr_file_system::parse_fs_spec(xr_file_system *this,xr_reader *r)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  path_alias *ppVar8;
  undefined1 *puVar9;
  ulong uVar10;
  byte *pbVar11;
  byte *pbVar12;
  int iVar13;
  byte *pbVar14;
  long lVar15;
  byte *pbVar16;
  long *plVar17;
  bool bVar18;
  string alias;
  string values [4];
  string local_e0;
  xr_file_system *local_c0;
  string local_b8;
  string local_98 [2];
  long local_58 [5];
  
  local_c0 = this;
  if (r->m_end < r->m_data) {
    __assert_fail("m_data <= m_end",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                  ,0x7a,"size_t xray_re::xr_reader::size() const");
  }
  pbVar12 = (byte *)(r->field_2).m_p_s8;
  lVar15 = (long)r->m_end - (long)r->m_data;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  lVar6 = 0x10;
  do {
    puVar9 = (undefined1 *)((long)&local_b8._M_dataplus._M_p + lVar6);
    *(undefined1 **)((long)&local_e0.field_2 + lVar6 + 8) = puVar9;
    *(undefined8 *)((long)&local_c0 + lVar6) = 0;
    *puVar9 = 0;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0x90);
  bVar18 = lVar15 < 1;
  if (lVar15 < 1) {
LAB_0015e86b:
    lVar6 = -0x80;
    plVar17 = local_58 + 2;
    do {
      if (plVar17 != (long *)plVar17[-2]) {
        operator_delete((long *)plVar17[-2],*plVar17 + 1);
      }
      plVar17 = plVar17 + -4;
      lVar6 = lVar6 + 0x20;
    } while (lVar6 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,
                      CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                               local_e0.field_2._M_local_buf[0]) + 1);
    }
    return bVar18;
  }
  pbVar16 = pbVar12 + lVar15;
  uVar10 = 1;
LAB_0015e590:
  bVar1 = *pbVar12;
  if (bVar1 == 0x3b) goto LAB_0015e801;
  if (bVar1 == 0x24) {
    if (pbVar12 < pbVar16) {
      pbVar11 = (byte *)0x0;
      if (pbVar12 + 1 < pbVar16) {
        iVar13 = (int)(char)pbVar12[1];
        iVar5 = isalnum(iVar13);
        if ((iVar13 == 0x5f) || (iVar5 != 0)) {
          pbVar14 = pbVar12 + 2;
          do {
            if (pbVar16 <= pbVar14) {
              pbVar11 = (byte *)0x0;
              goto LAB_0015e62d;
            }
            bVar1 = *pbVar14;
            if ((char)bVar1 == 0x24) {
              pbVar11 = pbVar14 + 1;
              cVar4 = '\x01';
            }
            else {
              iVar5 = isalnum((int)(char)bVar1);
              pbVar14 = pbVar14 + (bVar1 == 0x5f || iVar5 != 0);
              cVar4 = (bVar1 != 0x5f && iVar5 == 0) * '\x02';
            }
          } while (cVar4 == '\0');
          if (cVar4 == '\x01') goto LAB_0015e62d;
        }
        goto LAB_0015e62a;
      }
    }
    else {
LAB_0015e62a:
      pbVar11 = (byte *)0x0;
    }
LAB_0015e62d:
    if (pbVar11 != (byte *)0x0) {
      std::__cxx11::string::replace
                ((ulong)&local_e0,0,(char *)local_e0._M_string_length,(ulong)pbVar12);
      do {
        if (pbVar16 <= pbVar11) break;
        if ((*pbVar11 == 0x20) || (*pbVar11 == 9)) {
          pbVar11 = pbVar11 + 1;
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
      } while (bVar2);
      if ((pbVar11 != pbVar16) && (*pbVar11 == 0x3d)) {
        pbVar12 = pbVar11 + 1;
        uVar7 = 0xfffffffe;
LAB_0015e693:
        do {
          if (pbVar12 < pbVar16) {
            if ((*pbVar12 == 0x20) || (*pbVar12 == 9)) {
              pbVar12 = pbVar12 + 1;
              bVar2 = true;
            }
            else {
              bVar2 = false;
            }
            if (bVar2) goto LAB_0015e693;
          }
          pbVar11 = (byte *)0x0;
          pbVar14 = pbVar12;
          do {
            if (pbVar16 <= pbVar14) break;
            bVar1 = *pbVar14;
            if (bVar1 < 0xd) {
              if (bVar1 != 9) {
                pbVar3 = (byte *)0x0;
                if (bVar1 != 10) goto LAB_0015e701;
                goto LAB_0015e6ec;
              }
LAB_0015e6f7:
              pbVar3 = pbVar11;
              if (pbVar11 == (byte *)0x0) {
                pbVar3 = pbVar14;
              }
LAB_0015e701:
              pbVar11 = pbVar3;
              pbVar14 = pbVar14 + 1;
              bVar2 = true;
            }
            else {
              if ((bVar1 != 0xd) && (bVar1 != 0x7c)) {
                pbVar3 = (byte *)0x0;
                if (bVar1 == 0x20) goto LAB_0015e6f7;
                goto LAB_0015e701;
              }
LAB_0015e6ec:
              if (pbVar11 == (byte *)0x0) {
                pbVar11 = pbVar14;
              }
              bVar2 = false;
            }
          } while (bVar2);
          if (pbVar11 != (byte *)0x0) {
            pbVar14 = pbVar11;
          }
          iVar5 = (int)uVar7;
          if ((iVar5 < 0) && ((pbVar14 == pbVar16 || (*pbVar14 != 0x7c)))) {
            msg("can\'t parse line %u",uVar10);
            goto LAB_0015e86b;
          }
          if (-1 < iVar5) {
            std::__cxx11::string::replace
                      ((ulong)(&local_b8 + uVar7),0,(char *)local_98[uVar7 - 1]._M_string_length,
                       (ulong)pbVar12);
          }
          pbVar12 = pbVar14 + 1;
          if (((pbVar12 == pbVar16) || (*pbVar14 != 0x7c)) ||
             (uVar7 = (ulong)(iVar5 + 1), 2 < iVar5)) goto LAB_0015e774;
        } while( true );
      }
    }
    msg("can\'t parse line %u",uVar10);
    goto LAB_0015e86b;
  }
  iVar5 = isspace((int)(char)bVar1);
  if (iVar5 == 0) {
    msg("can\'t parse line %u",uVar10);
    goto LAB_0015e86b;
  }
LAB_0015e801:
  do {
    pbVar11 = pbVar12;
    if (pbVar16 <= pbVar12) break;
    pbVar11 = pbVar12 + 1;
    bVar1 = *pbVar12;
    pbVar12 = pbVar11;
  } while (bVar1 != 10);
  uVar10 = (ulong)((int)uVar10 + 1);
  bVar18 = pbVar16 <= pbVar11;
  pbVar12 = pbVar11;
  if (bVar18) goto LAB_0015e86b;
  goto LAB_0015e590;
LAB_0015e774:
  if (iVar5 < 0) {
    __assert_fail("i > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_file_system.cxx"
                  ,0xa8,"bool xray_re::xr_file_system::parse_fs_spec(xr_reader &)");
  }
  if (iVar5 == 0) {
    local_98[0]._M_string_length = 0;
    *local_98[0]._M_dataplus._M_p = '\0';
  }
  ppVar8 = add_path_alias(local_c0,&local_e0,&local_b8,local_98);
  if (ppVar8 == (path_alias *)0x0) {
    msg("can\'t parse line %u");
  }
  else {
    if (1 < iVar5) {
      std::__cxx11::string::_M_assign((string *)&ppVar8->filter);
    }
    if (2 < iVar5) {
      std::__cxx11::string::_M_assign((string *)&ppVar8->caption);
    }
  }
  if (ppVar8 == (path_alias *)0x0) goto LAB_0015e86b;
  goto LAB_0015e801;
}

Assistant:

bool xr_file_system::parse_fs_spec(xr_reader& r)
{
	const char* p = r.pointer<const char>();
	const char* end = p + r.size();
	std::string alias, values[4];
	for (unsigned line = 1; p < end; p = next_line(p, end), ++line) {
		int c = *p;
		if (c == '$') {
			const char* last = read_alias(p, end);
			if (last == 0) {
				msg("can't parse line %u", line);
				return false;
			}
			alias.assign(p, last);

			p = skip_ws(last, end);
			if (p == end || *p++ != '=') {
				msg("can't parse line %u", line);
				return false;
			}

			int i;
			for (i = -2; i < 4;) {
				last = read_value(p, end);
				if (i < 0 && (last == end || *last != '|')) {
					msg("can't parse line %u", line);
					return false;
				}
				if (i >= 0)
					values[i].assign(p, last);
				p = last + 1;
				++i;
				if (p == end || *last != '|')
					break;
			}
			assert(i > 0);
			if (i < 2)
				values[1].clear();
			path_alias* pa = add_path_alias(alias, values[0], values[1]);
			if (pa == 0) {
				msg("can't parse line %u", line);
				return false;
			}
			if (i > 2)
				pa->filter = values[2];
			if (i > 3)
				pa->caption = values[3];
		} else if (c != ';' && !std::isspace(c)) {
			msg("can't parse line %u", line);
			return false;
		}
	}
	return true;
}